

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::SocketWriter::~SocketWriter(SocketWriter *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_AbstractSocketWriter)._vptr_AbstractSocketWriter =
       (_func_int **)&PTR__SocketWriter_00158be0;
  if (this->sockfd_ != -1) {
    CloseConnection(this);
  }
  pcVar1 = (this->port_num_)._M_dataplus._M_p;
  paVar2 = &(this->port_num_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->host_name_)._M_dataplus._M_p;
  paVar2 = &(this->host_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~SocketWriter() {
      if (sockfd_ != -1)
        CloseConnection();
    }